

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.cpp
# Opt level: O3

void __thiscall
TPZDohrMatrix<float,_TPZDohrSubstructCondense<float>_>::Write
          (TPZDohrMatrix<float,_TPZDohrSubstructCondense<float>_> *this,TPZStream *buf,
          int withclassid)

{
  long *plVar1;
  int iVar2;
  undefined8 in_RAX;
  _List_node_base *p_Var3;
  int size;
  int classid;
  undefined8 local_28;
  
  local_28._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  TPZBaseMatrix::Write((TPZBaseMatrix *)this,buf,withclassid);
  TPZPersistenceManager::WritePointer(&((this->fAssembly).fRef)->fPointer->super_TPZSavable,buf);
  (*buf->_vptr_TPZStream[3])(buf,&this->fNumCoarse,1);
  (*buf->_vptr_TPZStream[3])(buf,&this->fNumThreads,1);
  local_28 = CONCAT44(local_28._4_4_,
                      (int)(this->fGlobal).
                           super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                           ._M_impl._M_node._M_size);
  (*buf->_vptr_TPZStream[3])(buf,&local_28,1);
  for (p_Var3 = (this->fGlobal).
                super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var3 != (_List_node_base *)&this->fGlobal; p_Var3 = p_Var3->_M_next) {
    plVar1 = (long *)(p_Var3[1]._M_next)->_M_next;
    (**(code **)(*plVar1 + 0x28))(plVar1,buf,0);
  }
  local_28 = local_28 & 0xffffffff00000000;
  iVar2 = (*(this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[4])
                    (this);
  local_28 = CONCAT44(iVar2,(undefined4)local_28);
  (*buf->_vptr_TPZStream[3])(buf,(long)&local_28 + 4,1);
  return;
}

Assistant:

void TPZDohrMatrix<TVar,TSubStruct >::Write( TPZStream &buf, int withclassid ) const
{
    SAVEABLE_STR_NOTE(buf,"TPZMatrix<TVar>::Write ()");
    TPZMatrix<TVar>::Write(buf, withclassid);
    SAVEABLE_STR_NOTE(buf,"fAssembly->Write");
    TPZPersistenceManager::WritePointer(fAssembly.operator ->(), &buf);
    SAVEABLE_STR_NOTE(buf,"fNumCoarse");
    buf.Write(&fNumCoarse);
    SAVEABLE_STR_NOTE(buf,"fNumThreads");
    buf.Write(&fNumThreads);
    int size = fGlobal.size();
    SAVEABLE_STR_NOTE(buf,"fGlobal.size()");
    buf.Write(&size);
    for (auto it=fGlobal.begin(); it != fGlobal.end(); it++) {
        SAVEABLE_STR_NOTE(buf,"fGlobal[...]");
        (*it)->Write(buf,0);
    }
    size = 0;
    int classid = ClassId();
    SAVEABLE_STR_NOTE(buf,"ClassId");
    buf.Write(&classid );
}